

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void disableTerm(WhereLevel *pLevel,WhereTerm *pTerm)

{
  bool bVar1;
  int local_1c;
  WhereTerm *pWStack_18;
  int nLoop;
  WhereTerm *pTerm_local;
  WhereLevel *pLevel_local;
  
  local_1c = 0;
  pWStack_18 = pTerm;
  while( true ) {
    bVar1 = false;
    if (((pWStack_18->wtFlags & 4) == 0) &&
       ((pLevel->iLeftJoin == 0 || (bVar1 = false, (pWStack_18->pExpr->flags & 1) != 0)))) {
      bVar1 = (pLevel->notReady & pWStack_18->prereqAll) == 0;
    }
    if (!bVar1) break;
    if ((local_1c == 0) || ((pWStack_18->wtFlags & 0x400) == 0)) {
      pWStack_18->wtFlags = pWStack_18->wtFlags | 4;
    }
    else {
      pWStack_18->wtFlags = pWStack_18->wtFlags | 0x200;
    }
    if (pWStack_18->iParent < 0) {
      return;
    }
    pWStack_18 = pWStack_18->pWC->a + pWStack_18->iParent;
    pWStack_18->nChild = pWStack_18->nChild + 0xff;
    if (pWStack_18->nChild != '\0') {
      return;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void disableTerm(WhereLevel *pLevel, WhereTerm *pTerm){
  int nLoop = 0;
  assert( pTerm!=0 );
  while( (pTerm->wtFlags & TERM_CODED)==0
      && (pLevel->iLeftJoin==0 || ExprHasProperty(pTerm->pExpr, EP_FromJoin))
      && (pLevel->notReady & pTerm->prereqAll)==0
  ){
    if( nLoop && (pTerm->wtFlags & TERM_LIKE)!=0 ){
      pTerm->wtFlags |= TERM_LIKECOND;
    }else{
      pTerm->wtFlags |= TERM_CODED;
    }
    if( pTerm->iParent<0 ) break;
    pTerm = &pTerm->pWC->a[pTerm->iParent];
    assert( pTerm!=0 );
    pTerm->nChild--;
    if( pTerm->nChild!=0 ) break;
    nLoop++;
  }
}